

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.cpp
# Opt level: O2

void __thiscall ast::Section::write32(Section *this,uint offset,uint32_t value)

{
  uint new_capacity;
  
  new_capacity = offset + 4;
  if (this->content_capacity < new_capacity) {
    enlarge(this,new_capacity);
  }
  this->content[offset] = (uint8_t)value;
  this->content[offset + 1] = (uint8_t)(value >> 8);
  this->content[offset + 2] = (uint8_t)(value >> 0x10);
  this->content[offset + 3] = (uint8_t)(value >> 0x18);
  if (this->content_size < new_capacity) {
    this->content_size = new_capacity;
  }
  return;
}

Assistant:

void Section::write32(unsigned offset, uint32_t value)
{
	auto limit_superior = offset + 4;
	if (limit_superior > content_capacity)
		enlarge(limit_superior);
	content[offset]     = static_cast<uint8_t >(value);
	content[offset + 1] = static_cast<uint8_t >(value >> 8);
	content[offset + 2] = static_cast<uint8_t >(value >> 16);
	content[offset + 3] = static_cast<uint8_t >(value >> 24);
	if (limit_superior > content_size)
		content_size = offset + 4;
}